

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

bool __thiscall ClipperLib::Clipper::IsContributing(Clipper *this,TEdge *edge)

{
  PolyFillType PVar1;
  PolyFillType PVar2;
  ClipType CVar3;
  PolyFillType PVar4;
  PolyFillType PVar5;
  
  PVar1 = this->m_ClipFillType;
  PVar2 = this->m_SubjFillType;
  PVar5 = PVar1;
  PVar4 = PVar2;
  if (edge->polyType == ptSubject) {
    PVar5 = PVar2;
    PVar4 = PVar1;
  }
  if (PVar5 < pftPositive) {
    if ((edge->windCnt + 1U & 0xfffffffd) != 0) {
      return false;
    }
  }
  else if (PVar5 == pftPositive) {
    if (edge->windCnt != 1) {
      return false;
    }
  }
  else if (edge->windCnt != -1) {
    return false;
  }
  CVar3 = this->m_ClipType;
  if (CVar3 == ctDifference) {
    PVar4 = PVar1;
    if (edge->polyType == ptSubject) goto joined_r0x0063edcc;
  }
  else {
    if (CVar3 == ctUnion) {
joined_r0x0063edcc:
      if (PVar4 < pftPositive) {
        return edge->windCnt2 == 0;
      }
      if (PVar4 == pftPositive) {
        return edge->windCnt2 < 1;
      }
      return -1 < edge->windCnt2;
    }
    PVar2 = PVar4;
    if (CVar3 != ctIntersection) {
      return true;
    }
  }
  if (PVar2 < pftPositive) {
    return edge->windCnt2 != 0;
  }
  if (PVar2 == pftPositive) {
    return 0 < edge->windCnt2;
  }
  return SUB41((uint)edge->windCnt2 >> 0x1f,0);
}

Assistant:

bool Clipper::IsContributing(const TEdge& edge) const
{
  PolyFillType pft, pft2;
  if (edge.polyType == ptSubject)
  {
    pft = m_SubjFillType;
    pft2 = m_ClipFillType;
  } else
  {
    pft = m_ClipFillType;
    pft2 = m_SubjFillType;
  }

  switch(pft)
  {
    case pftEvenOdd: 
    case pftNonZero:
      if (Abs(edge.windCnt) != 1) return false;
      break;
    case pftPositive: 
      if (edge.windCnt != 1) return false;
      break;
    default: //pftNegative
      if (edge.windCnt != -1) return false;
  }

  switch(m_ClipType)
  {
    case ctIntersection:
      switch(pft2)
      {
        case pftEvenOdd: 
        case pftNonZero: 
          return (edge.windCnt2 != 0);
        case pftPositive: 
          return (edge.windCnt2 > 0);
        default: 
          return (edge.windCnt2 < 0);
      }
    case ctUnion:
      switch(pft2)
      {
        case pftEvenOdd: 
        case pftNonZero: 
          return (edge.windCnt2 == 0);
        case pftPositive: 
          return (edge.windCnt2 <= 0);
        default: 
          return (edge.windCnt2 >= 0);
      }
    case ctDifference:
      if (edge.polyType == ptSubject)
        switch(pft2)
        {
          case pftEvenOdd: 
          case pftNonZero: 
            return (edge.windCnt2 == 0);
          case pftPositive: 
            return (edge.windCnt2 <= 0);
          default: 
            return (edge.windCnt2 >= 0);
        }
      else
        switch(pft2)
        {
          case pftEvenOdd: 
          case pftNonZero: 
            return (edge.windCnt2 != 0);
          case pftPositive: 
            return (edge.windCnt2 > 0);
          default: 
            return (edge.windCnt2 < 0);
        }
    default:
      return true;
  }
}